

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void google::protobuf::compiler::ruby::GenerateOneof(OneofDescriptor *oneof,Printer *printer)

{
  int iVar1;
  string *value;
  FieldDescriptor *field_00;
  FieldDescriptor *field;
  int i;
  Printer *printer_local;
  OneofDescriptor *oneof_local;
  
  value = OneofDescriptor::name_abi_cxx11_(oneof);
  io::Printer::Print(printer,"oneof :$name$ do\n","name",value);
  io::Printer::Indent(printer);
  field._4_4_ = 0;
  while( true ) {
    iVar1 = OneofDescriptor::field_count(oneof);
    if (iVar1 <= field._4_4_) break;
    field_00 = OneofDescriptor::field(oneof,field._4_4_);
    GenerateField(field_00,printer);
    field._4_4_ = field._4_4_ + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n");
  return;
}

Assistant:

void GenerateOneof(const google::protobuf::OneofDescriptor* oneof,
                   google::protobuf::io::Printer* printer) {
  printer->Print(
      "oneof :$name$ do\n",
      "name", oneof->name());
  printer->Indent();

  for (int i = 0; i < oneof->field_count(); i++) {
    const FieldDescriptor* field = oneof->field(i);
    GenerateField(field, printer);
  }

  printer->Outdent();
  printer->Print("end\n");
}